

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool settings::has_prefix
               (char *s,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *prefixes)

{
  char cVar1;
  pointer pbVar2;
  size_t __n;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  pointer pbVar4;
  
  pbVar2 = (prefixes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (prefixes->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1) {
    __n = pbVar4->_M_string_length;
    iVar3 = strncmp(s,(pbVar4->_M_dataplus)._M_p,__n);
    if (iVar3 == 0) {
      cVar1 = s[__n];
      if ((cVar1 == '\0') || (cVar1 == '_')) break;
      iVar3 = tolower((int)cVar1);
      if (iVar3 != cVar1) break;
    }
  }
  return pbVar4 != pbVar2;
}

Assistant:

bool has_prefix(const char * s, const vector<string> & prefixes)
  {
    for (auto && val : prefixes)
      if (!strncmp(s, val.c_str(), val.length()))
      {
        char next = s[val.length()];
        if (!next || next == '_' || next != tolower(next))
          return true;
      }

    return false;
  }